

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qotd.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Any_data _Var1;
  uint uVar2;
  void *pvVar3;
  int __n;
  int __fd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  quotes;
  uniform_int_distribution<unsigned_long> distribution;
  _Any_data local_2748;
  _Manager_type local_2738;
  _Invoker_type p_Stack_2730;
  random_device rd;
  mt19937 rng;
  _Any_data __tmp;
  
  quotes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  quotes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  quotes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    std::__cxx11::string::string((string *)&rd,"Sorry, no quote today, mate.\n",(allocator *)&rng);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&quotes,&rd,
               (undefined1 *)((long)&rd.field_0 + 0x20));
  }
  else {
    std::__cxx11::string::string((string *)&rd,argv[1],(allocator *)local_2748._M_pod_data);
    readQuotes((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&rng,(string *)&rd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&quotes,&rng);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rng);
  }
  std::__cxx11::string::~string((string *)&rd);
  std::random_device::random_device(&rd);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rng,(ulong)uVar2);
  distribution._M_param._M_b =
       ((long)quotes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)quotes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  distribution._M_param._M_a = 0;
  signal(2,handleExitSignal);
  __fd = 0x411;
  Server::setPort(&server,0x411);
  local_2738 = (_Manager_type)0x0;
  p_Stack_2730 = (_Invoker_type)0x0;
  local_2748 = (_Any_data)ZEXT816(0);
  pvVar3 = operator_new(0x18);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)pvVar3 = &quotes;
  *(uniform_int_distribution<unsigned_long> **)((long)pvVar3 + 8) = &distribution;
  *(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    **)((long)pvVar3 + 0x10) = &rng;
  local_2738 = server._handleAccept.super__Function_base._M_manager;
  local_2748._M_unused._M_object = pvVar3;
  _Var1 = local_2748;
  local_2748 = server._handleAccept.super__Function_base._M_functor;
  server._handleAccept.super__Function_base._M_functor = _Var1;
  server._handleAccept.super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/qotd.cc:65:20)>
       ::_M_manager;
  p_Stack_2730 = server._handleAccept._M_invoker;
  server._handleAccept._M_invoker =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/qotd.cc:65:20)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_2748);
  Server::listen(&server,__fd,__n);
  std::random_device::~random_device(&rd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&quotes);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  std::vector<std::string> quotes;

  if( argc > 1 )
    quotes = readQuotes( argv[1] );
  else
    quotes = { "Sorry, no quote today, mate.\n" };

  std::random_device rd;
  std::mt19937 rng( rd() );
  std::uniform_int_distribution<std::size_t> distribution( 0, quotes.size() - 1 );

  signal( SIGINT, handleExitSignal );

  server.setPort( 1041 );

  server.onAccept( [&] ( std::weak_ptr<ClientSocket> socket )
  {
    if( auto s = socket.lock() )
    {
      s->write( quotes.at( distribution( rng ) ) );
      s->close();
    }
  } );

  server.listen();

  return 0;
}